

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvKrylovDemo_prec.c
# Opt level: O0

int PSolve(sunrealtype tn,N_Vector c,N_Vector fc,N_Vector r,N_Vector z,sunrealtype gamma,
          sunrealtype delta,int lr,void *user_data)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  long lVar9;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long in_R9;
  WebData wdata;
  int mp;
  int ngx;
  int my;
  int mx;
  int *jigy;
  int *jigx;
  int ig;
  int iv;
  int igy;
  int igx;
  int jy;
  int jx;
  sunindextype **pivot;
  sunrealtype ***P;
  WebData in_stack_000000b8;
  N_Vector in_stack_000000c0;
  N_Vector in_stack_000000c8;
  sunrealtype in_stack_000000d0;
  undefined4 local_6c;
  undefined4 local_60;
  undefined4 local_5c;
  
  N_VScale(0x3ff0000000000000,in_RDX,in_RCX);
  GSIter(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,in_stack_000000b8);
  iVar1 = *(int *)(in_R9 + 0x50);
  iVar2 = *(int *)(in_R9 + 0x54);
  iVar3 = *(int *)(in_R9 + 0x5c);
  iVar4 = *(int *)(in_R9 + 0x48);
  local_6c = 0;
  for (local_60 = 0; local_60 < iVar2; local_60 = local_60 + 1) {
    iVar5 = *(int *)(in_R9 + 0x98 + (long)local_60 * 4);
    for (local_5c = 0; local_5c < iVar1; local_5c = local_5c + 1) {
      iVar8 = *(int *)(in_R9 + 0x80 + (long)local_5c * 4) + iVar5 * iVar3;
      uVar6 = *(undefined8 *)(in_R9 + (long)iVar8 * 8);
      uVar7 = *(undefined8 *)(in_R9 + 0x20 + (long)iVar8 * 8);
      lVar9 = N_VGetArrayPointer(in_RCX);
      SUNDlsMat_denseGETRS(uVar6,(long)iVar4,uVar7,lVar9 + (long)local_6c * 8);
      local_6c = iVar4 + local_6c;
    }
  }
  return 0;
}

Assistant:

static int PSolve(sunrealtype tn, N_Vector c, N_Vector fc, N_Vector r, N_Vector z,
                  sunrealtype gamma, sunrealtype delta, int lr, void* user_data)
{
  sunrealtype*** P;
  sunindextype** pivot;
  int jx, jy, igx, igy, iv, ig, *jigx, *jigy, mx, my, ngx, mp;
  WebData wdata;

  wdata = (WebData)user_data;

  N_VScale(ONE, r, z);

  /* call GSIter for Gauss-Seidel iterations */

  GSIter(gamma, z, wdata->tmp, wdata);

  /* Do backsolves for inverse of block-diagonal preconditioner factor */

  P     = wdata->P;
  pivot = wdata->pivot;
  mx    = wdata->mx;
  my    = wdata->my;
  ngx   = wdata->ngx;
  mp    = wdata->mp;
  jigx  = wdata->jigx;
  jigy  = wdata->jigy;

  iv = 0;
  for (jy = 0; jy < my; jy++)
  {
    igy = jigy[jy];
    for (jx = 0; jx < mx; jx++)
    {
      igx = jigx[jx];
      ig  = igx + igy * ngx;
      SUNDlsMat_denseGETRS(P[ig], mp, pivot[ig], &(N_VGetArrayPointer(z)[iv]));
      iv += mp;
    }
  }

  return (0);
}